

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall QMakeParser::warnOperator(QMakeParser *this,char *msg)

{
  storage_type *psVar1;
  QByteArrayView *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QStack_a8;
  QByteArrayView local_98;
  QByteArrayView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  char *msg_local;
  long local_28;
  
  this_00 = &QStack_a8;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  msg_local = msg;
  if (this->m_invert != 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("Stray NOT operator %1.",0x17);
    QVar2.m_data = psVar1;
    QVar2.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar2);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,&msg_local);
    QVar3.m_data = (storage_type *)local_88.m_size;
    QVar3.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar3);
    QString::arg<QString,_true>
              ((QString *)&local_48,(QString *)&local_60,(QString *)&local_78,0,(QChar)0x20);
    languageWarning(this,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    this->m_invert = 0;
  }
  if (this->m_operator == OrOperator) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("Stray OR operator %1.",0x16);
    QVar5.m_data = psVar1;
    QVar5.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar5);
  }
  else {
    if (this->m_operator != AndOperator) goto LAB_0020633a;
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("Stray AND operator %1.",0x17);
    QVar4.m_data = psVar1;
    QVar4.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar4);
    this_00 = &local_98;
  }
  QByteArrayView::QByteArrayView<const_char_*,_true>(this_00,&msg_local);
  QVar6.m_data = (storage_type *)this_00->m_size;
  QVar6.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar6);
  QString::arg<QString,_true>
            ((QString *)&local_48,(QString *)&local_60,(QString *)&local_78,0,(QChar)0x20);
  languageWarning(this,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  this->m_operator = NoOperator;
LAB_0020633a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeParser::warnOperator(const char *msg)
{
    if (m_invert) {
        languageWarning(fL1S("Stray NOT operator %1.").arg(fL1S(msg)));
        m_invert = 0;
    }
    if (m_operator == AndOperator) {
        languageWarning(fL1S("Stray AND operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
    } else if (m_operator == OrOperator) {
        languageWarning(fL1S("Stray OR operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
    }
}